

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

void __thiscall FIntermissionActionFader::FIntermissionActionFader(FIntermissionActionFader *this)

{
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionAction_006f0740;
  (this->super_FIntermissionAction).mMusic.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mBackground.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mPalette.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mSound.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 4;
  (this->super_FIntermissionAction).mOverlays.Array = (FIntermissionPatch *)0x0;
  (this->super_FIntermissionAction).mOverlays.Most = 0;
  (this->super_FIntermissionAction).mOverlays.Count = 0;
  (this->super_FIntermissionAction).mSize = 0x60;
  (this->super_FIntermissionAction).mClass = DIntermissionScreen::RegistrationInfo.MyClass;
  (this->super_FIntermissionAction).mFlatfill = false;
  (this->super_FIntermissionAction).mMusicLooping = true;
  (this->super_FIntermissionAction).mMusicOrder = 0;
  (this->super_FIntermissionAction).mCdTrack = 0;
  (this->super_FIntermissionAction).mCdId = 0;
  (this->super_FIntermissionAction).mDuration = 0;
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionAction_006f0768;
  (this->super_FIntermissionAction).mSize = 0x68;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenFader::RegistrationInfo.MyClass;
  this->mFadeType = FADE_In;
  return;
}

Assistant:

FIntermissionAction::FIntermissionAction()
{
	mSize = sizeof(FIntermissionAction);
	mClass = RUNTIME_CLASS(DIntermissionScreen);
	mMusicOrder =
	mCdId = 
	mCdTrack = 
	mDuration = 0;
	mFlatfill = false;
	mMusicLooping = true;
}